

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O2

string * __thiscall
Lib::Exception::toString<char_const*,std::__cxx11::string,char_const*>
          (string *__return_storage_ptr__,Exception *this,char *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg_1,char *msg_2)

{
  stringstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__cxx11::string::string((string *)&bStack_1c8,(string *)msg_1);
  OutputAll<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  ::apply(local_198,msg,&bStack_1c8,msg_2);
  std::__cxx11::string::~string((string *)&bStack_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(Msg... msg){
    std::stringstream out;
    OutputAll<Msg...>::apply(out, msg...);
    return out.str();
  }